

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,StatsAccumulator *accum)

{
  long *in_FS_OFFSET;
  int64_t in_stack_00000098;
  int64_t in_stack_000000a0;
  char *in_stack_000000a8;
  StatsAccumulator *in_stack_000000b0;
  
  StatsAccumulator::ReportRatio
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  *(undefined8 *)(*in_FS_OFFSET + -800) = 0;
  *(undefined8 *)(*in_FS_OFFSET + -0x318) = 0;
  return;
}

Assistant:

ParsedScene::ParsedScene() {
    // Allocate _graphicsState_
    graphicsState = new GraphicsState;

    // Set scene defaults
    ParameterDictionary dict({}, RGBColorSpace::sRGB);
    materials.push_back(SceneEntity("diffuse", dict, {}));

    accelerator.name = "bvh";

    camera.name = "perspective";

    sampler.name = "pmj02bn";

    filter.name = "gaussian";

    film.name = "rgb";
    film.parameters = ParameterDictionary({}, RGBColorSpace::sRGB);

    integrator.name = "volpath";
}